

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replistruct.cpp
# Opt level: O0

void __thiscall
r_comp::RepliCondition::RepliCondition(RepliCondition *this,string *name,bool reversed)

{
  bool reversed_local;
  string *name_local;
  RepliCondition *this_local;
  
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::operator=((string *)this,(string *)name);
  this->reversed = reversed;
  return;
}

Assistant:

RepliCondition::RepliCondition(const std::string &name, bool reversed)
{
    this->name = name;
    this->reversed = reversed;
}